

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateConditional(ExpressionEvalContext *ctx,ExprConditional *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  int iVar6;
  long in_RAX;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  longlong result;
  long local_28;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 != 0) && ((ctx->stackFrames).data[uVar1 - 1]->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar3;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248688;
    return pEVar7;
  }
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    local_28 = in_RAX;
    pEVar7 = Evaluate(ctx,expression->condition);
    if (pEVar7 != (ExprBase *)0x0) {
      bVar5 = TryTakeLong(pEVar7,&local_28);
      if (!bVar5) {
        Report(ctx,"ERROR: failed to evaluate ternary operator condition");
        return (ExprBase *)0x0;
      }
      pEVar7 = Evaluate(ctx,(&expression->trueBlock)[local_28 == 0]);
      if (pEVar7 != (ExprBase *)0x0) {
        pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
        return pEVar7;
      }
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateConditional(ExpressionEvalContext &ctx, ExprConditional *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	long long result;
	if(!TryTakeLong(condition, result))
		return Report(ctx, "ERROR: failed to evaluate ternary operator condition");

	ExprBase *value = Evaluate(ctx, result ? expression->trueBlock : expression->falseBlock);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}